

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v8::detail::
for_each_codepoint<fmt::v8::detail::compute_width(fmt::v8::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  detail *pdVar1;
  detail *pdVar2;
  detail *pdVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  type size;
  size_t __n;
  char *pcVar9;
  detail *__src;
  byte *pbVar10;
  anon_class_8_1_54a39806 decode;
  char buf [7];
  count_code_points local_40;
  byte local_38 [8];
  
  local_40.count = (size_t *)s.size_;
  pcVar9 = s.data_;
  __src = this;
  if (((char *)0x3 < pcVar9) && (this < this + (long)pcVar9 + -3)) {
    do {
      uVar8 = (uint)((byte)*__src >> 3);
      lVar7 = (long)(char)(&DAT_001400d0)[uVar8] + (ulong)((0x80ff0000U >> uVar8 & 1) != 0);
      pdVar1 = __src + 1;
      pdVar2 = __src + 2;
      pdVar3 = __src + 3;
      uVar8 = ((byte)*pdVar3 & 0x3f |
              ((byte)*pdVar2 & 0x3f) << 6 |
              ((byte)*pdVar1 & 0x3f) << 0xc |
              ((int)(char)*__src & *(uint *)(&DAT_0013ffa0 + lVar7 * 4)) << 0x12) >>
              ((&DAT_0013ffe0)[lVar7 * 4] & 0x1f);
      __src = __src + lVar7;
      anon_func::count_code_points::operator()
                (&local_40,uVar8,
                 ((((byte)*pdVar1 >> 2 & 0xfffffff0) + (uint)((byte)*pdVar2 >> 6) * 4 |
                   (uint)((byte)*pdVar3 >> 6) |
                   (uint)(uVar8 < *(uint *)(&DAT_0013ffc0 + lVar7 * 4)) << 6 |
                   (uint)(0x10ffff < uVar8) << 8 | (uint)((uVar8 & 0xfffff800) == 0xd800) << 7) ^
                 0x2a) >> ((&DAT_00140000)[lVar7 * 4] & 0x1f));
    } while (__src < this + (long)pcVar9 + -3);
  }
  __n = (long)(this + (long)pcVar9) - (long)__src;
  if (__n != 0) {
    local_38[4] = 0;
    local_38[5] = 0;
    local_38[6] = 0;
    local_38[0] = 0;
    local_38[1] = 0;
    local_38[2] = 0;
    local_38[3] = 0;
    memcpy(local_38,__src,__n);
    pbVar10 = local_38;
    do {
      uVar8 = (uint)(*pbVar10 >> 3);
      lVar7 = (long)(char)(&DAT_001400d0)[uVar8] + (ulong)((0x80ff0000U >> uVar8 & 1) != 0);
      pbVar4 = pbVar10 + 1;
      pbVar5 = pbVar10 + 2;
      pbVar6 = pbVar10 + 3;
      uVar8 = (*pbVar6 & 0x3f |
              (*pbVar5 & 0x3f) << 6 |
              (*pbVar4 & 0x3f) << 0xc |
              ((int)(char)*pbVar10 & *(uint *)(&DAT_0013ffa0 + lVar7 * 4)) << 0x12) >>
              ((&DAT_0013ffe0)[lVar7 * 4] & 0x1f);
      pbVar10 = pbVar10 + lVar7;
      anon_func::count_code_points::operator()
                (&local_40,uVar8,
                 (((*pbVar4 >> 2 & 0xfffffff0) + (uint)(*pbVar5 >> 6) * 4 | (uint)(*pbVar6 >> 6) |
                   (uint)(uVar8 < *(uint *)(&DAT_0013ffc0 + lVar7 * 4)) << 6 |
                   (uint)(0x10ffff < uVar8) << 8 | (uint)((uVar8 & 0xfffff800) == 0xd800) << 7) ^
                 0x2a) >> ((&DAT_00140000)[lVar7 * 4] & 0x1f));
    } while ((long)pbVar10 - (long)local_38 < (long)__n);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    f(cp, error);
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = decode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    p = buf;
    do {
      p = decode(p);
    } while (p - buf < num_chars_left);
  }
}